

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void monitor_list_destroy(monitor_list *monitor_list)

{
  list *list;
  node *pnVar1;
  
  free(monitor_list->extension);
  list = monitor_list->monitors;
  pnVar1 = list->head;
  if (pnVar1 != (node *)0x0) {
    do {
      free(pnVar1->data);
      pnVar1 = pnVar1->next;
    } while (pnVar1 != (node *)0x0);
    list = monitor_list->monitors;
  }
  list_destroy(list);
  free(monitor_list);
  return;
}

Assistant:

void monitor_list_destroy(struct monitor_list *monitor_list)
{
        free(monitor_list->extension);
        monitors_destroy(monitor_list->monitors);
        list_destroy(monitor_list->monitors);
        free(monitor_list);
}